

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

void * cache_alloc(cache *c)

{
  config_mutex_t *mutex;
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  
  sVar6 = 0;
  uVar2 = c->page_size / (c->entry_size + 1);
  mutex = &c->mutex;
  pthread_lock_mutex(mutex);
  do {
    if (sVar6 == c->page_count) {
      uVar1 = add_page(c);
      if ((int)uVar1 < 0) {
        pthread_unlock_mutex(mutex);
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = c->pages[uVar1];
        pcVar5[c->entry_size * uVar2] = '\x01';
        pthread_unlock_mutex(mutex);
      }
      return pcVar5;
    }
    pcVar5 = c->pages[sVar6];
    lVar3 = c->entry_size * uVar2;
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      if (pcVar5[uVar4 + lVar3] == '\0') {
        pcVar5[uVar4 + lVar3] = '\x01';
        pthread_unlock_mutex(mutex);
        return pcVar5 + uVar4 * c->entry_size;
      }
    }
    sVar6 = sVar6 + 1;
  } while( true );
}

Assistant:

void *
cache_alloc( struct cache *c ) {
  size_t i;
  size_t j;
  size_t entries_per_page;
  int new_page;
  char *current_page;
  char *locks;

  entries_per_page = c->page_size / ( c->entry_size + sizeof( char ) );

  config_lock_mutex( &c->mutex );

  for( i = 0; i < c->page_count; i++ ) {
    current_page = c->pages[i];
    locks = current_page + ( entries_per_page * c->entry_size );
    for( j = 0; j < entries_per_page; j++ ) {
      if( locks[j] == 0 ) {
        locks[j] = 1;
        config_unlock_mutex( &c->mutex );
        return current_page + ( j * c->entry_size );
      }
    }
  }

  new_page = add_page( c );
  if( new_page < 0 ) {
    config_unlock_mutex( &c->mutex );
    return NULL;
  }

  current_page = c->pages[new_page];
  locks = current_page + ( entries_per_page * c->entry_size );
  locks[0] = 1;
  config_unlock_mutex( &c->mutex );
  return current_page;
}